

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

StringRef llvm::yaml::ScalarTraits<llvm::yaml::Hex8,_void>::input
                    (StringRef Scalar,void *param_2,Hex8 *Val)

{
  bool bVar1;
  ulong in_RAX;
  char *pcVar2;
  unsigned_long_long *in_R8;
  StringRef SVar3;
  StringRef Str;
  size_t sStack_20;
  ulong local_18;
  unsigned_long_long n;
  
  Str.Data = Scalar.Length;
  Str.Length = 0;
  local_18 = in_RAX;
  bVar1 = getAsUnsignedInteger((llvm *)Scalar.Data,Str,(uint)&local_18,in_R8);
  if (bVar1) {
    pcVar2 = "invalid hex8 number";
    sStack_20 = 0x13;
  }
  else if (local_18 < 0x100) {
    Val->value = (uint8_t)local_18;
    sStack_20 = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = "out of range hex8 number";
    sStack_20 = 0x18;
  }
  SVar3.Length = sStack_20;
  SVar3.Data = pcVar2;
  return SVar3;
}

Assistant:

StringRef ScalarTraits<Hex8>::input(StringRef Scalar, void *, Hex8 &Val) {
  unsigned long long n;
  if (getAsUnsignedInteger(Scalar, 0, n))
    return "invalid hex8 number";
  if (n > 0xFF)
    return "out of range hex8 number";
  Val = n;
  return StringRef();
}